

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

void uv__stream_eof(uv_stream_t *stream,uv_buf_t *buf)

{
  byte *pbVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  
  pbVar1 = (byte *)((long)&stream->flags + 1);
  *pbVar1 = *pbVar1 | 8;
  uv__io_stop(stream->loop,&stream->io_watcher,1);
  iVar4 = uv__io_active(&stream->io_watcher,4);
  if (((iVar4 == 0) && (uVar3 = stream->flags, (uVar3 & 4) != 0)) &&
     (stream->flags = uVar3 & 0xfffffffb, (uVar3 & 8) != 0)) {
    puVar2 = &stream->loop->active_handles;
    *puVar2 = *puVar2 - 1;
  }
  (*stream->read_cb)(stream,-0xfff,buf,stream->read_cb_arg);
  pbVar1 = (byte *)((long)&stream->flags + 1);
  *pbVar1 = *pbVar1 & 0xef;
  return;
}

Assistant:

static void uv__stream_eof(uv_stream_t* stream, const uv_buf_t* buf) {
  stream->flags |= UV_HANDLE_READ_EOF;
  uv__io_stop(stream->loop, &stream->io_watcher, POLLIN);
  if (!uv__io_active(&stream->io_watcher, POLLOUT))
    uv__handle_stop(stream);
  uv__stream_osx_interrupt_select(stream);
  stream->read_cb(stream, UV_EOF, buf, stream->read_cb_arg);
  stream->flags &= ~UV_HANDLE_READING;
}